

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzero.cpp
# Opt level: O2

bool __thiscall Functor::operator==(Functor *this,Functor *other)

{
  __type _Var1;
  
  _Var1 = std::operator==(&this->id,&other->id);
  return _Var1 && this->arity == other->arity;
}

Assistant:

bool operator==(const Functor &other) const {
        return id == other.id && arity == other.arity;
    }